

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

void uv__async_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv__queue *puVar1;
  int iVar2;
  uv__queue *puVar3;
  ssize_t sVar4;
  int *piVar5;
  uv__queue queue;
  char buf [1024];
  uv__queue local_428;
  undefined1 local_418 [1024];
  
  if (&loop->async_io_watcher != w) {
    __assert_fail("w == &loop->async_io_watcher",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/async.c"
                  ,0x8c,"void uv__async_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  do {
    do {
      sVar4 = read(w->fd,local_418,0x400);
    } while (sVar4 == 0x400);
    if (sVar4 != -1) goto LAB_0014f47a;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  if (*piVar5 != 0xb) {
    abort();
  }
LAB_0014f47a:
  puVar1 = &loop->async_handles;
  local_428.next = (loop->async_handles).next;
  if (local_428.next != puVar1) {
    local_428.prev = (loop->async_handles).prev;
    (local_428.prev)->next = &local_428;
    puVar3 = (local_428.next)->prev;
    (loop->async_handles).prev = puVar3;
    puVar3->next = puVar1;
    (local_428.next)->prev = &local_428;
    while (local_428.next != &local_428) {
      puVar3 = (local_428.next)->next;
      (local_428.next)->prev->next = puVar3;
      puVar3->prev = (local_428.next)->prev;
      (local_428.next)->next = puVar1;
      puVar3 = (loop->async_handles).prev;
      (local_428.next)->prev = puVar3;
      puVar3->next = local_428.next;
      (loop->async_handles).prev = local_428.next;
      LOCK();
      iVar2 = *(int *)&local_428.next[1].next;
      *(undefined4 *)&local_428.next[1].next = 0;
      UNLOCK();
      if ((iVar2 != 0) && (local_428.next[-1].prev != (uv__queue *)0x0)) {
        (*(code *)local_428.next[-1].prev)(&local_428.next[-7].prev);
      }
    }
  }
  return;
}

Assistant:

static void uv__async_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  char buf[1024];
  ssize_t r;
  struct uv__queue queue;
  struct uv__queue* q;
  uv_async_t* h;
  _Atomic int *pending;

  assert(w == &loop->async_io_watcher);

  for (;;) {
    r = read(w->fd, buf, sizeof(buf));

    if (r == sizeof(buf))
      continue;

    if (r != -1)
      break;

    if (errno == EAGAIN || errno == EWOULDBLOCK)
      break;

    if (errno == EINTR)
      continue;

    abort();
  }

  uv__queue_move(&loop->async_handles, &queue);
  while (!uv__queue_empty(&queue)) {
    q = uv__queue_head(&queue);
    h = uv__queue_data(q, uv_async_t, queue);

    uv__queue_remove(q);
    uv__queue_insert_tail(&loop->async_handles, q);

    /* Atomically fetch and clear pending flag */
    pending = (_Atomic int*) &h->pending;
    if (atomic_exchange(pending, 0) == 0)
      continue;

    if (h->async_cb == NULL)
      continue;

    h->async_cb(h);
  }
}